

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdfs_test.cpp
# Opt level: O0

void FrequencyTable(BSDF *bsdf,Vector3f *wo,RNG *rng,int sampleCount,int thetaRes,int phiRes,
                   Float *target)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  int *piVar4;
  int in_ECX;
  long lVar5;
  undefined8 in_RDI;
  int in_R8D;
  int in_R9D;
  float x;
  double dVar6;
  undefined1 auVar7 [64];
  Vector3f VVar9;
  Point2f *unaff_retaddr;
  undefined4 in_stack_00000008;
  Float in_stack_0000000c;
  BSDF *in_stack_00000010;
  int phiBin;
  int thetaBin;
  Point2f coords;
  Vector3f wiL;
  BSDFSample bs;
  Point2f sample;
  Float u;
  int i;
  Vector3f wi;
  Float factorPhi;
  Float factorTheta;
  float in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  uint in_stack_ffffffffffffff50;
  float in_stack_ffffffffffffff54;
  BSDFSample local_6c;
  float local_40;
  int local_3c;
  float local_2c;
  float local_28;
  int local_24;
  int local_20;
  int local_1c;
  undefined1 auVar8 [56];
  
  local_24 = in_R9D;
  local_20 = in_R8D;
  local_1c = in_ECX;
  memset((void *)CONCAT44(in_stack_0000000c,in_stack_00000008),0,(long)(in_R8D * in_R9D) << 2);
  local_28 = (float)local_20 / 3.1415927;
  local_2c = (float)local_24 / 6.2831855;
  pbrt::Vector3<float>::Vector3((Vector3<float> *)0x4f4e6c);
  for (local_3c = 0; local_3c < local_1c; local_3c = local_3c + 1) {
    local_40 = pbrt::RNG::Uniform<float>
                         ((RNG *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    x = pbrt::RNG::Uniform<float>
                  ((RNG *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    pbrt::RNG::Uniform<float>((RNG *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    pbrt::Point2<float>::Point2
              ((Point2<float> *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),x,
               in_stack_ffffffffffffff28);
    auVar8 = (undefined1  [56])0x0;
    pbrt::BSDF::Sample_f
              (in_stack_00000010,_coords,in_stack_0000000c,unaff_retaddr,
               (TransportMode)((ulong)in_RDI >> 0x20),(BxDFReflTransFlags)in_RDI);
    bVar3 = pbrt::BSDFSample::operator_cast_to_bool(&local_6c);
    if ((bVar3) && (bVar3 = pbrt::BSDFSample::IsSpecular((BSDFSample *)0x4f4f52), !bVar3)) {
      VVar9 = pbrt::BSDF::RenderToLocal
                        ((BSDF *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                         (Vector3f *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      auVar7._0_8_ = VVar9.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar7._8_56_ = auVar8;
      uVar1 = vmovlpd_avx(auVar7._0_16_);
      in_stack_ffffffffffffff28 = pbrt::SafeACos(0.0);
      in_stack_ffffffffffffff28 = in_stack_ffffffffffffff28 * local_28;
      std::atan2((double)(uVar1 >> 0x20),(double)(uVar1 & 0xffffffff));
      pbrt::Point2<float>::Point2
                ((Point2<float> *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),x,
                 in_stack_ffffffffffffff28);
      if (in_stack_ffffffffffffff54 < 0.0) {
        auVar2 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40c90fdb),0),ZEXT416((uint)local_2c),
                                 ZEXT416((uint)in_stack_ffffffffffffff54));
        in_stack_ffffffffffffff54 = auVar2._0_4_;
      }
      in_stack_ffffffffffffff48 = 0;
      dVar6 = std::floor((double)(ulong)in_stack_ffffffffffffff50);
      local_bc = (int)SUB84(dVar6,0);
      piVar4 = std::max<int>((int *)&stack0xffffffffffffff48,&local_bc);
      local_c0 = local_20 + -1;
      piVar4 = std::min<int>(piVar4,&local_c0);
      in_stack_ffffffffffffff4c = *piVar4;
      local_c8 = 0;
      dVar6 = std::floor((double)(ulong)(uint)in_stack_ffffffffffffff54);
      in_stack_ffffffffffffff34 = (int)SUB84(dVar6,0);
      piVar4 = std::max<int>(&local_c8,(int *)&stack0xffffffffffffff34);
      in_stack_ffffffffffffff30 = local_24 + -1;
      piVar4 = std::min<int>(piVar4,(int *)&stack0xffffffffffffff30);
      local_c4 = *piVar4;
      lVar5 = (long)(in_stack_ffffffffffffff4c * local_24 + local_c4);
      *(float *)(CONCAT44(in_stack_0000000c,in_stack_00000008) + lVar5 * 4) =
           *(float *)(CONCAT44(in_stack_0000000c,in_stack_00000008) + lVar5 * 4) + 1.0;
    }
  }
  return;
}

Assistant:

void FrequencyTable(const BSDF* bsdf, const Vector3f& wo, RNG& rng, int sampleCount,
                    int thetaRes, int phiRes, Float* target) {
    memset(target, 0, thetaRes * phiRes * sizeof(Float));

    Float factorTheta = thetaRes / Pi, factorPhi = phiRes / (2 * Pi);

    Vector3f wi;
    for (int i = 0; i < sampleCount; ++i) {
        Float u = rng.Uniform<Float>();
        Point2f sample{rng.Uniform<Float>(), rng.Uniform<Float>()};
        BSDFSample bs = bsdf->Sample_f(wo, u, sample);

        if (!bs || bs.IsSpecular())
            continue;

        Vector3f wiL = bsdf->RenderToLocal(bs.wi);

        Point2f coords(SafeACos(wiL.z) * factorTheta,
                       std::atan2(wiL.y, wiL.x) * factorPhi);

        if (coords.y < 0)
            coords.y += 2 * Pi * factorPhi;

        int thetaBin = std::min(std::max(0, (int)std::floor(coords.x)), thetaRes - 1);
        int phiBin = std::min(std::max(0, (int)std::floor(coords.y)), phiRes - 1);

        target[thetaBin * phiRes + phiBin] += 1;
    }
}